

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blockfilterindex.cpp
# Opt level: O0

bool __thiscall
BlockFilterIndex::Write
          (BlockFilterIndex *this,BlockFilter *filter,uint32_t block_height,uint256 *filter_header)

{
  long lVar1;
  bool bVar2;
  size_t sVar3;
  undefined8 in_RSI;
  BlockFilter *in_RDI;
  long in_FS_OFFSET;
  size_t bytes_written;
  BlockFilterIndex *in_stack_00000040;
  pair<uint256,_(anonymous_namespace)::DBVal> value;
  undefined7 in_stack_ffffffffffffff28;
  undefined1 in_stack_ffffffffffffff2f;
  undefined1 fSync;
  BlockFilter *value_00;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  CDBWrapper *in_stack_ffffffffffffff70;
  
  fSync = (undefined1)((ulong)in_RSI >> 0x38);
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  value_00 = in_RDI;
  sVar3 = WriteFilterToDisk(in_stack_00000040,(FlatFilePos *)this,filter);
  if (sVar3 == 0) {
    bVar2 = false;
  }
  else {
    std::pair<uint256,_(anonymous_namespace)::DBVal>::
    pair<uint256,_(anonymous_namespace)::DBVal,_true>
              ((pair<uint256,_(anonymous_namespace)::DBVal> *)in_RDI);
    BlockFilter::GetBlockHash
              ((BlockFilter *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    BlockFilter::GetHash(in_RDI);
    std::unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_>::operator->
              ((unique_ptr<BaseIndex::DB,_std::default_delete<BaseIndex::DB>_> *)
               CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28));
    anon_unknown.dwarf_ca4292::DBHeightKey::DBHeightKey
              ((DBHeightKey *)CONCAT17(in_stack_ffffffffffffff2f,in_stack_ffffffffffffff28),0);
    bVar2 = CDBWrapper::
            Write<(anonymous_namespace)::DBHeightKey,std::pair<uint256,(anonymous_namespace)::DBVal>>
                      (in_stack_ffffffffffffff70,
                       (DBHeightKey *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68),
                       (pair<uint256,_(anonymous_namespace)::DBVal> *)value_00,(bool)fSync);
    if (((bVar2 ^ 0xffU) & 1) == 0) {
      *(int *)((long)&in_RDI[1].m_filter.m_encoded.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_finish + 4) =
           *(int *)((long)&in_RDI[1].m_filter.m_encoded.
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
                           .super__Vector_impl_data._M_finish + 4) + (int)sVar3;
      bVar2 = true;
    }
    else {
      bVar2 = false;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return bVar2;
  }
  __stack_chk_fail();
}

Assistant:

bool BlockFilterIndex::Write(const BlockFilter& filter, uint32_t block_height, const uint256& filter_header)
{
    size_t bytes_written = WriteFilterToDisk(m_next_filter_pos, filter);
    if (bytes_written == 0) return false;

    std::pair<uint256, DBVal> value;
    value.first = filter.GetBlockHash();
    value.second.hash = filter.GetHash();
    value.second.header = filter_header;
    value.second.pos = m_next_filter_pos;

    if (!m_db->Write(DBHeightKey(block_height), value)) {
        return false;
    }

    m_next_filter_pos.nPos += bytes_written;
    return true;
}